

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int pagerFlushOnCommit(Pager *pPager,int bCommit)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  PCache *p;
  
  if (pPager->tempFile == '\0') {
    return 1;
  }
  uVar1 = 0;
  if ((bCommit != 0) && (pPager->fd->pMethods != (sqlite3_io_methods *)0x0)) {
    p = pPager->pPCache;
    iVar2 = numberOfCachePages(p);
    lVar3 = 0;
    for (; p->pDirty != (PgHdr *)0x0; p = (PCache *)&p->pDirty->pDirtyNext) {
      lVar3 = lVar3 + 100;
    }
    if (iVar2 == 0) {
      return 0;
    }
    uVar1 = (uint)(0x18 < (int)(lVar3 / (long)iVar2));
  }
  return uVar1;
}

Assistant:

static int pagerFlushOnCommit(Pager *pPager, int bCommit){
  if( pPager->tempFile==0 ) return 1;
  if( !bCommit ) return 0;
  if( !isOpen(pPager->fd) ) return 0;
  return (sqlite3PCachePercentDirty(pPager->pPCache)>=25);
}